

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float32_to_float128_sparc(float32 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t a_1;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  float128 fVar8;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = a & 0x80000000;
  }
  uVar6 = a & 0x7fffff;
  uVar5 = (ulong)(a >> 0x1f);
  if ((char)(a >> 0x17) == '\0') {
    if (uVar6 != 0) {
      uVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar6 = uVar6 << ((char)(uVar3 ^ 0x1f) - 8U & 0x1f);
      uVar3 = 8 - (uVar3 ^ 0x1f);
      goto LAB_009dffdc;
    }
    uVar5 = uVar5 << 0x3f;
  }
  else {
    uVar3 = a >> 0x17 & 0xff;
    if (uVar3 != 0xff) {
LAB_009dffdc:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = ((ulong)(uVar3 + 0x3f80) << 0x30) + (uVar5 << 0x3f | (ulong)uVar6 << 0x19);
      return (float128)(auVar1 << 0x40);
    }
    if (uVar6 != 0) {
      if ((a & 0x3fffff) != 0 && (a & 0x7fc00000) == 0x7f800000) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      bVar7 = status->default_nan_mode != '\0';
      uVar4 = 0x7fffffffffffffff;
      if (!bVar7) {
        uVar4 = uVar5 << 0x3f | (ulong)a << 0x19 | 0x7fff000000000000;
      }
      fVar8.low = -(ulong)bVar7;
      fVar8.high = uVar4;
      return fVar8;
    }
    uVar5 = uVar5 << 0x3f | 0x7fff000000000000;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  return (float128)(auVar2 << 0x40);
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}